

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

big_integer * anon_unknown.dwarf_a832::rand_big(big_integer *__return_storage_ptr__,size_t size)

{
  int iVar1;
  big_integer local_78;
  big_integer local_48;
  size_t local_28;
  size_t i;
  size_t local_18;
  size_t size_local;
  big_integer *result;
  
  i._7_1_ = 0;
  local_18 = size;
  size_local = (size_t)__return_storage_ptr__;
  iVar1 = rand();
  big_integer::big_integer(__return_storage_ptr__,iVar1);
  for (local_28 = 0; local_28 != local_18; local_28 = local_28 + 1) {
    big_integer::big_integer(&local_48,0x7fffffff);
    big_integer::operator*=(__return_storage_ptr__,&local_48);
    big_integer::~big_integer(&local_48);
    iVar1 = rand();
    big_integer::big_integer(&local_78,iVar1);
    big_integer::operator+=(__return_storage_ptr__,&local_78);
    big_integer::~big_integer(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

big_integer rand_big(size_t size) {
        big_integer result = rand();

        for (size_t i = 0; i != size; ++i) {
            result *= RAND_MAX;
            result += rand();
        }

        return result;
    }